

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

RTPTime __thiscall
jrtplib::RTCPScheduler::CalculateTransmissionInterval(RTCPScheduler *this,bool sender)

{
  RTPTime RVar1;
  double extraout_XMM0_Qa;
  
  RVar1 = CalculateDeterministicInterval(this,sender);
  (*this->rtprand->_vptr_RTPRandom[5])();
  return (RTPTime)(((extraout_XMM0_Qa + 0.5) * RVar1.m_t) / 1.21828);
}

Assistant:

RTPTime RTCPScheduler::CalculateTransmissionInterval(bool sender)
{
	RTPTime Td = CalculateDeterministicInterval(sender);
	double td,mul,T;

//	std::cout << "CalculateTransmissionInterval" << std::endl;

	td = Td.GetDouble();
	mul = rtprand.GetRandomDouble()+0.5; // gives random value between 0.5 and 1.5
	T = (td*mul)/1.21828; // see RFC 3550 p 30

//	std::cout << "  Td: " << td << std::endl;
//	std::cout << "  mul: " << mul << std::endl;
//	std::cout << "  T: " << T << std::endl;

	return RTPTime(T);
}